

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRoots.cpp
# Opt level: O3

void sort(int nx,double *x)

{
  double dVar1;
  double __tmp;
  double dVar2;
  double __tmp_1;
  double dVar3;
  
  if (nx == 3) {
    dVar1 = *x;
    dVar3 = x[1];
    dVar2 = dVar1;
    if (dVar3 < dVar1) {
      *x = dVar3;
      x[1] = dVar1;
      dVar2 = dVar3;
      dVar3 = dVar1;
    }
    dVar1 = x[2];
    if (dVar1 < dVar3) {
      x[1] = dVar1;
      x[2] = dVar3;
      dVar3 = dVar1;
    }
    if (dVar2 <= dVar3) {
      return;
    }
    *x = dVar3;
  }
  else {
    if (nx != 2) {
      return;
    }
    dVar2 = *x;
    if (dVar2 <= x[1]) {
      return;
    }
    *x = x[1];
  }
  x[1] = dVar2;
  return;
}

Assistant:

void
sort (int nx, double x[])
{
    if (nx == 2)
    {
        if (x[0] > x[1]) swap (x[0], x[1]);
    }

    if (nx == 3)
    {
        if (x[0] > x[1]) swap (x[0], x[1]);
        if (x[1] > x[2]) swap (x[1], x[2]);
        if (x[0] > x[1]) swap (x[0], x[1]);
    }
}